

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O2

void mserialize::
     StructSerializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
     ::serialize<binlog::detail::RecoverableVectorOutputStream>
               (ClockSync *t,RecoverableVectorOutputStream *ostream)

{
  serialize<unsigned_long,binlog::detail::RecoverableVectorOutputStream>(&t->clockValue,ostream);
  serialize<unsigned_long,binlog::detail::RecoverableVectorOutputStream>(&t->clockFrequency,ostream)
  ;
  serialize<unsigned_long,binlog::detail::RecoverableVectorOutputStream>(&t->nsSinceEpoch,ostream);
  serialize<int,binlog::detail::RecoverableVectorOutputStream>(&t->tzOffset,ostream);
  detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(&t->tzName,ostream);
  return;
}

Assistant:

static void serialize(const T& t, OutputStream& ostream)
  {
    using swallow = int[];
    (void)swallow{1, (serialize_member(t, Members::value, ostream), int{})...};
  }